

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckTypeIndex
          (ScriptValidator *this,Location *loc,Type actual,Type expected,char *desc,Index index,
          char *index_kind)

{
  Index IVar1;
  char *pcVar2;
  char *loc_00;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string local_88;
  string local_68;
  Type local_48;
  Type local_40;
  Enum local_38;
  Index local_34;
  char *pcStack_30;
  Index index_local;
  char *desc_local;
  Location *loc_local;
  ScriptValidator *this_local;
  Type expected_local;
  Type actual_local;
  
  local_48 = expected;
  local_40 = actual;
  local_34 = index;
  pcStack_30 = desc;
  desc_local = (char *)loc;
  loc_local = (Location *)this;
  this_local = (ScriptValidator *)expected;
  expected_local = actual;
  local_38 = (Enum)TypeChecker::CheckType(actual,expected);
  bVar3 = Failed((Result)local_38);
  loc_00 = desc_local;
  pcVar2 = pcStack_30;
  IVar1 = local_34;
  if (bVar3) {
    Type::GetName_abi_cxx11_(&local_68,&expected_local);
    uVar4 = std::__cxx11::string::c_str();
    Type::GetName_abi_cxx11_(&local_88,(Type *)&this_local);
    uVar5 = std::__cxx11::string::c_str();
    PrintError(this,(Location *)loc_00,"type mismatch for %s %u of %s. got %s, expected %s",
               index_kind,(ulong)IVar1,pcVar2,uVar4,uVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void ScriptValidator::CheckTypeIndex(const Location* loc,
                                     Type actual,
                                     Type expected,
                                     const char* desc,
                                     Index index,
                                     const char* index_kind) {
  if (Failed(TypeChecker::CheckType(actual, expected))) {
    PrintError(loc,
               "type mismatch for %s %" PRIindex " of %s. got %s, expected %s",
               index_kind, index, desc, actual.GetName().c_str(),
               expected.GetName().c_str());
  }
}